

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O0

void __thiscall Txid_TxidFromHex_Test::TestBody(Txid_TxidFromHex_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_148;
  Message local_140;
  ByteData local_138;
  string local_120;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Message local_e8;
  int local_dc;
  ByteData local_d8;
  size_t local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  Message local_a0;
  string local_98;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Txid txid;
  Txid_TxidFromHex_Test *this_local;
  
  txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"1234567890123456789012345678901234567890123456789012345678901234",
             &local_51);
  cfd::core::Txid::Txid((Txid *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_98,(Txid *)local_30);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_78,"txid.GetHex().c_str()",
             "\"1234567890123456789012345678901234567890123456789012345678901234\"",pcVar2,
             "1234567890123456789012345678901234567890123456789012345678901234");
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_txid.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  cfd::core::Txid::GetData(&local_d8,(Txid *)local_30);
  local_c0 = cfd::core::ByteData::GetDataSize(&local_d8);
  local_dc = 0x20;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_b8,"txid.GetData().GetDataSize()","32",&local_c0,&local_dc);
  cfd::core::ByteData::~ByteData(&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_txid.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  cfd::core::Txid::GetData(&local_138,(Txid *)local_30);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_120,&local_138);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_100,"txid.GetData().GetHex().c_str()",
             "\"3412907856341290785634129078563412907856341290785634129078563412\"",pcVar2,
             "3412907856341290785634129078563412907856341290785634129078563412");
  std::__cxx11::string::~string((string *)&local_120);
  cfd::core::ByteData::~ByteData(&local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_txid.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  cfd::core::Txid::~Txid((Txid *)local_30);
  return;
}

Assistant:

TEST(Txid, TxidFromHex) {
  Txid txid = Txid(
      "1234567890123456789012345678901234567890123456789012345678901234");
  EXPECT_STREQ(
      txid.GetHex().c_str(),
      "1234567890123456789012345678901234567890123456789012345678901234");
  EXPECT_EQ(txid.GetData().GetDataSize(), 32);
  EXPECT_STREQ(
      txid.GetData().GetHex().c_str(),
      "3412907856341290785634129078563412907856341290785634129078563412");
}